

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::HairSetNode::convert_bezier_to_bspline(HairSetNode *this)

{
  undefined8 *puVar1;
  size_t *psVar2;
  size_t sVar3;
  pointer pHVar4;
  uint uVar5;
  pointer pvVar6;
  long lVar7;
  Hair HVar8;
  ulong uVar9;
  avector<Vec3ff> local_50;
  
  if ((this->type & ~RTC_GEOMETRY_TYPE_QUAD) == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE) {
    pvVar6 = (this->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar6) {
      lVar7 = 0;
      uVar9 = 0;
      do {
        bezier_to_bspline_helper
                  (&local_50,&this->hairs,(avector<Vec3ff> *)(&pvVar6->field_0x0 + lVar7));
        pvVar6 = (this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        alignedFree(*(void **)((long)&pvVar6->items + lVar7));
        sVar3 = local_50.size_active;
        puVar1 = (undefined8 *)((long)&pvVar6->size_active + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&pvVar6->items + lVar7) = 0;
        local_50.size_active = 0;
        psVar2 = (size_t *)((long)&pvVar6->size_active + lVar7);
        *psVar2 = sVar3;
        psVar2[1] = local_50.size_alloced;
        local_50.size_alloced = 0;
        *(Vec3fx **)((long)&pvVar6->items + lVar7) = local_50.items;
        local_50.items = (Vec3fx *)0x0;
        alignedFree((void *)0x0);
        local_50.size_active = 0;
        local_50.size_alloced = 0;
        local_50.items = (Vec3fx *)0x0;
        uVar9 = uVar9 + 1;
        pvVar6 = (this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x20;
      } while (uVar9 < (ulong)((long)(this->positions).
                                     super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 5)
              );
    }
    pHVar4 = (this->hairs).
             super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->hairs).
        super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
        ._M_impl.super__Vector_impl_data._M_finish != pHVar4) {
      uVar5 = 0;
      uVar9 = 0;
      do {
        HVar8.id = 0;
        HVar8.vertex = uVar5;
        pHVar4[uVar9] = HVar8;
        uVar9 = uVar9 + 1;
        pHVar4 = (this->hairs).
                 super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = uVar5 + 4;
      } while (uVar9 < (ulong)((long)(this->hairs).
                                     super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar4 >> 3)
              );
    }
    this->type = this->type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE ^
                 RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::convert_bezier_to_bspline()
  {
    if (type != RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE &&
        type != RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
      return;

    for (size_t i=0; i<positions.size(); i++) {
      positions[i] = bezier_to_bspline_helper(hairs,positions[i]);
    }
    for (size_t i=0; i<hairs.size(); i++) {
      hairs[i] = SceneGraph::HairSetNode::Hair(unsigned(4*i),0);
    }

    if (type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
      type = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;
    else
      type = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
  }